

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O1

void __thiscall
so_5::disp::one_thread::impl::
actual_dispatcher_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::actual_dispatcher_t
          (actual_dispatcher_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this,disp_params_t *params)

{
  _Any_data _Stack_38;
  code *local_28;
  
  so_5::dispatcher_t::dispatcher_t((dispatcher_t *)this);
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
       (_func_int **)&PTR__actual_dispatcher_t_0028ce00;
  std::
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  ::function((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
              *)&_Stack_38,&(params->m_queue_params).m_lock_factory);
  reuse::work_thread::details::
  work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>::
  work_thread_template_t(&this->m_work_thread,(lock_factory_t *)&_Stack_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  (this->m_agents_bound).super___atomic_base<unsigned_long>._M_i = 0;
  stats::source_t::source_t(&(this->m_data_source).super_source_t);
  (this->m_data_source).
  super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  .m_base_prefix.m_value[0] = '\0';
  (this->m_data_source).
  super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  .m_work_thread_prefix.m_value[0] = '\0';
  (this->m_data_source).
  super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  .m_work_thread = &this->m_work_thread;
  (this->m_data_source).
  super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  .m_agents_bound = &this->m_agents_bound;
  (this->m_data_source).super_source_t._vptr_source_t = (_func_int **)&PTR_distribute_0028cf08;
  (this->m_data_source).m_env = (environment_t *)0x0;
  return;
}

Assistant:

actual_dispatcher_t( disp_params_t params )
			:	m_work_thread{ params.queue_params().lock_factory() }
			,	m_data_source( m_work_thread, m_agents_bound )
			{}